

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangular.cpp
# Opt level: O2

void calc<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>
               (string *Ja_in,string *Jb_in,string *Jc_in)

{
  long lVar1;
  ostream *poVar2;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  *in_R8;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  local_2a8;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  local_258;
  tc local_208 [8];
  uint auStack_200 [2];
  uint local_1f8 [2];
  uint auStack_1f0 [2];
  uint local_1e8 [2];
  uint auStack_1e0 [2];
  uint local_1d8 [2];
  uint auStack_1d0 [2];
  int local_1c8;
  undefined1 local_1c4;
  fpclass_type local_1c0;
  int32_t iStack_1bc;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  local_1b8;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  tc;
  real_t Jc;
  real_t Jb;
  real_t Ja;
  
  convert<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>
            (&Ja,Ja_in);
  convert<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>
            (&Jb,Jb_in);
  convert<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>
            (&Jc,Jc_in);
  local_208 = (tc  [8])Ja.base.m_backend.data._M_elems._0_8_;
  auStack_200[0] = Ja.base.m_backend.data._M_elems[2];
  auStack_200[1] = Ja.base.m_backend.data._M_elems[3];
  local_1f8[0] = Ja.base.m_backend.data._M_elems[4];
  local_1f8[1] = Ja.base.m_backend.data._M_elems[5];
  auStack_1f0[0] = Ja.base.m_backend.data._M_elems[6];
  auStack_1f0[1] = Ja.base.m_backend.data._M_elems[7];
  local_1e8[0] = Ja.base.m_backend.data._M_elems[8];
  local_1e8[1] = Ja.base.m_backend.data._M_elems[9];
  auStack_1e0[0] = Ja.base.m_backend.data._M_elems[10];
  auStack_1e0[1] = Ja.base.m_backend.data._M_elems[0xb];
  local_1d8[0] = Ja.base.m_backend.data._M_elems[0xc];
  local_1d8[1] = Ja.base.m_backend.data._M_elems[0xd];
  auStack_1d0[0] = Ja.base.m_backend.data._M_elems[0xe];
  auStack_1d0[1] = Ja.base.m_backend.data._M_elems[0xf];
  local_1c8 = Ja.base.m_backend.exp;
  local_1c4 = Ja.base.m_backend.neg;
  local_1c0 = Ja.base.m_backend.fpclass;
  iStack_1bc = Ja.base.m_backend.prec_elem;
  local_258.base.m_backend.data._M_elems[0] = Jb.base.m_backend.data._M_elems[0];
  local_258.base.m_backend.data._M_elems[1] = Jb.base.m_backend.data._M_elems[1];
  local_258.base.m_backend.data._M_elems[2] = Jb.base.m_backend.data._M_elems[2];
  local_258.base.m_backend.data._M_elems[3] = Jb.base.m_backend.data._M_elems[3];
  local_258.base.m_backend.data._M_elems[4] = Jb.base.m_backend.data._M_elems[4];
  local_258.base.m_backend.data._M_elems[5] = Jb.base.m_backend.data._M_elems[5];
  local_258.base.m_backend.data._M_elems[6] = Jb.base.m_backend.data._M_elems[6];
  local_258.base.m_backend.data._M_elems[7] = Jb.base.m_backend.data._M_elems[7];
  local_258.base.m_backend.data._M_elems[8] = Jb.base.m_backend.data._M_elems[8];
  local_258.base.m_backend.data._M_elems[9] = Jb.base.m_backend.data._M_elems[9];
  local_258.base.m_backend.data._M_elems[10] = Jb.base.m_backend.data._M_elems[10];
  local_258.base.m_backend.data._M_elems[0xb] = Jb.base.m_backend.data._M_elems[0xb];
  local_258.base.m_backend.data._M_elems[0xc] = Jb.base.m_backend.data._M_elems[0xc];
  local_258.base.m_backend.data._M_elems[0xd] = Jb.base.m_backend.data._M_elems[0xd];
  local_258.base.m_backend.data._M_elems[0xe] = Jb.base.m_backend.data._M_elems[0xe];
  local_258.base.m_backend.data._M_elems[0xf] = Jb.base.m_backend.data._M_elems[0xf];
  local_258.base.m_backend.exp = Jb.base.m_backend.exp;
  local_258.base.m_backend.neg = Jb.base.m_backend.neg;
  local_258.base.m_backend.fpclass = Jb.base.m_backend.fpclass;
  local_258.base.m_backend.prec_elem = Jb.base.m_backend.prec_elem;
  local_2a8.base.m_backend.data._M_elems[0] = Jc.base.m_backend.data._M_elems[0];
  local_2a8.base.m_backend.data._M_elems[1] = Jc.base.m_backend.data._M_elems[1];
  local_2a8.base.m_backend.data._M_elems[2] = Jc.base.m_backend.data._M_elems[2];
  local_2a8.base.m_backend.data._M_elems[3] = Jc.base.m_backend.data._M_elems[3];
  local_2a8.base.m_backend.data._M_elems[4] = Jc.base.m_backend.data._M_elems[4];
  local_2a8.base.m_backend.data._M_elems[5] = Jc.base.m_backend.data._M_elems[5];
  local_2a8.base.m_backend.data._M_elems[6] = Jc.base.m_backend.data._M_elems[6];
  local_2a8.base.m_backend.data._M_elems[7] = Jc.base.m_backend.data._M_elems[7];
  local_2a8.base.m_backend.data._M_elems[8] = Jc.base.m_backend.data._M_elems[8];
  local_2a8.base.m_backend.data._M_elems[9] = Jc.base.m_backend.data._M_elems[9];
  local_2a8.base.m_backend.data._M_elems[10] = Jc.base.m_backend.data._M_elems[10];
  local_2a8.base.m_backend.data._M_elems[0xb] = Jc.base.m_backend.data._M_elems[0xb];
  local_2a8.base.m_backend.data._M_elems[0xc] = Jc.base.m_backend.data._M_elems[0xc];
  local_2a8.base.m_backend.data._M_elems[0xd] = Jc.base.m_backend.data._M_elems[0xd];
  local_2a8.base.m_backend.data._M_elems[0xe] = Jc.base.m_backend.data._M_elems[0xe];
  local_2a8.base.m_backend.data._M_elems[0xf] = Jc.base.m_backend.data._M_elems[0xf];
  local_2a8.base.m_backend.exp = Jc.base.m_backend.exp;
  local_2a8.base.m_backend.neg = Jc.base.m_backend.neg;
  local_2a8.base.m_backend.fpclass = Jc.base.m_backend.fpclass;
  local_2a8.base.m_backend.prec_elem = Jc.base.m_backend.prec_elem;
  ising::tc::
  triangular<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>
            (&tc,local_208,&local_258,&local_2a8,in_R8);
  lVar1 = std::cout;
  *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) & 0xfffffefb |
       0x100;
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar1 + -0x18)) = 100;
  poVar2 = std::operator<<((ostream *)&std::cout,"# lattice: triangular\n");
  poVar2 = std::operator<<(poVar2,"# precision: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,100);
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(poVar2,"# Ja Jb Jc Tc 1/Tc");
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = boost::multiprecision::operator<<(poVar2,&Ja.base);
  poVar2 = std::operator<<(poVar2,' ');
  poVar2 = boost::multiprecision::operator<<(poVar2,&Jb.base);
  poVar2 = std::operator<<(poVar2,' ');
  poVar2 = boost::multiprecision::operator<<(poVar2,&Jc.base);
  poVar2 = std::operator<<(poVar2,' ');
  poVar2 = boost::multiprecision::operator<<(poVar2,&tc.base);
  poVar2 = std::operator<<(poVar2,' ');
  operator/(&local_1b8,1,&tc);
  poVar2 = boost::multiprecision::operator<<(poVar2,&local_1b8.base);
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void calc(const std::string& Ja_in, const std::string& Jb_in, const std::string& Jc_in) {
  typedef T real_t;
  real_t Ja = convert<real_t>(Ja_in);
  real_t Jb = convert<real_t>(Jb_in);
  real_t Jc = convert<real_t>(Jc_in);
  auto tc = ising::tc::triangular(Ja, Jb, Jc);
  std::cout << std::scientific << std::setprecision(std::numeric_limits<real_t>::digits10)
            << "# lattice: triangular\n"
            << "# precision: " << std::numeric_limits<real_t>::digits10 << std::endl
            << "# Ja Jb Jc Tc 1/Tc" << std::endl
            << Ja << ' ' << Jb << ' ' << Jc << ' ' << tc << ' ' << (1 / tc) << std::endl;
}